

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessComputeShaderArguments
          (ConversionStream *this,iterator *TypeToken,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *GlobalVariables,String *Prologue)

{
  TokenListType *this_00;
  ShaderParameterInfo *pSVar1;
  ShaderParameterInfo *Args_1;
  HLSL2GLSLConverterImpl *pHVar2;
  _Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *p_Var3;
  pointer pSVar4;
  bool bVar5;
  _List_node_base *p_Var6;
  long lVar7;
  ostream *poVar8;
  ShaderParameterInfo *pSVar9;
  const_iterator cVar10;
  undefined1 *puVar11;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> __first;
  ConversionStream *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  ShaderParameterInfo *NextMember;
  Char **Args_00;
  pointer pSVar12;
  String *in_stack_fffffffffffffba8;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_450;
  string err_4;
  Char *ExpectedLiteral;
  pointer ppSStack_420;
  pointer local_418;
  __node_base local_410;
  pointer local_408;
  ConversionStream *local_400;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  String GLSLVariable;
  String *local_3b8 [2];
  String CSGroupSize [3];
  stringstream PrologueSS;
  ostream local_330 [376];
  stringstream GlobalVarsSS;
  ostream local_1a8 [376];
  
  Args = Prologue;
  local_410._M_nxt = (_Hash_node_base *)Params;
  std::__cxx11::stringstream::stringstream((stringstream *)&GlobalVarsSS);
  std::__cxx11::stringstream::stringstream((stringstream *)&PrologueSS);
  local_450._M_node = TypeToken->_M_node->_M_prev;
  this_00 = &this->m_Tokens;
  p_Var6 = (this->m_Tokens).
           super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_408 = (pointer)TypeToken;
  if ((local_450._M_node == p_Var6) || (*(int *)&local_450._M_node[1]._M_next != 0x138)) {
    FormatString<char[31]>(CSGroupSize,(char (*) [31])"Missing numthreads declaration");
    in_stack_fffffffffffffba8 = &err_4;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (in_stack_fffffffffffffba8,this,&local_450,4);
    Args = CSGroupSize;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcac,Args,(char (*) [2])0x5ddb85,in_stack_fffffffffffffba8);
    std::__cxx11::string::~string((string *)&err_4);
    std::__cxx11::string::~string((string *)CSGroupSize);
    p_Var6 = (this_00->
             super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  }
  for (; local_450._M_node != p_Var6; local_450._M_node = (local_450._M_node)->_M_prev) {
    __first._M_node = local_450._M_node;
    if (*(int *)&local_450._M_node[1]._M_next == 0x137) goto LAB_0029eb34;
  }
  FormatString<char[33]>(CSGroupSize,(char (*) [33])"Missing numthreads() declaration");
  in_stack_fffffffffffffba8 = &err_4;
  PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
            (in_stack_fffffffffffffba8,this,&local_450,4);
  Args = CSGroupSize;
  LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
            (false,"ProcessComputeShaderArguments",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0xcb2,Args,(char (*) [2])0x5ddb85,in_stack_fffffffffffffba8);
  std::__cxx11::string::~string((string *)&err_4);
  std::__cxx11::string::~string((string *)CSGroupSize);
  __first._M_node = local_450._M_node;
LAB_0029eb34:
  local_450._M_node = (__first._M_node)->_M_next;
  if (((local_450._M_node == (_List_node_base *)this_00) ||
      (*(int *)&local_450._M_node[1]._M_next != 0x13b)) ||
     (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_450._M_node[1]._M_prev,"numthreads"), !bVar5)) {
    FormatString<char[33]>(CSGroupSize,(char (*) [33])"Missing numthreads() declaration");
    in_stack_fffffffffffffba8 = &err_4;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (in_stack_fffffffffffffba8,this,&local_450,4);
    Args = CSGroupSize;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcb9,Args,(char (*) [2])0x5ddb85,in_stack_fffffffffffffba8);
    std::__cxx11::string::~string((string *)&err_4);
    std::__cxx11::string::~string((string *)CSGroupSize);
  }
  local_450._M_node = (local_450._M_node)->_M_next;
  if ((local_450._M_node == (_List_node_base *)this_00) ||
     (*(int *)&local_450._M_node[1]._M_next != 0x135)) {
    FormatString<char[29]>(CSGroupSize,(char (*) [29])"Missing \'(\' after numthreads");
    in_stack_fffffffffffffba8 = &err_4;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (in_stack_fffffffffffffba8,this,&local_450,4);
    Args = CSGroupSize;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcbf,Args,(char (*) [2])0x5ddb85,in_stack_fffffffffffffba8);
    std::__cxx11::string::~string((string *)&err_4);
    std::__cxx11::string::~string((string *)CSGroupSize);
  }
  lVar7 = 0x10;
  do {
    puVar11 = (undefined1 *)((long)&CSGroupSize[0]._M_dataplus._M_p + lVar7);
    *(undefined1 **)((long)local_3b8 + lVar7) = puVar11;
    *(undefined8 *)((long)CSGroupSize + lVar7 + -8) = 0;
    *puVar11 = 0;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x70);
  Args_00 = ProcessComputeShaderArguments::DirNames;
  local_400 = this;
  local_3b8[0] = GlobalVariables;
  local_3b8[1] = Prologue;
  for (lVar7 = 0; pSVar12 = local_408, lVar7 != 0x60; lVar7 = lVar7 + 0x20) {
    local_450._M_node = (local_450._M_node)->_M_next;
    if ((local_450._M_node == (_List_node_base *)this_00) ||
       (1 < *(int *)&local_450._M_node[1]._M_next - 0x13bU)) {
      FormatString<char[24],char_const*,char[11]>
                (&err_4,(Diligent *)"Missing group size for ",(char (*) [24])Args_00,
                 (char **)" direction",(char (*) [11])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&GLSLVariable,local_400,&local_450,4);
      Args = &err_4;
      in_stack_fffffffffffffba8 = &GLSLVariable;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcc9,&err_4,(char (*) [2])0x5ddb85,&GLSLVariable);
      std::__cxx11::string::~string((string *)&GLSLVariable);
      std::__cxx11::string::~string((string *)&err_4);
    }
    std::__cxx11::string::assign((char *)((long)&CSGroupSize[0]._M_dataplus._M_p + lVar7));
    local_450._M_node = (local_450._M_node)->_M_next;
    ExpectedLiteral = ",";
    if (lVar7 == 0x40) {
      ExpectedLiteral = ")";
    }
    if ((local_450._M_node == (_List_node_base *)this_00) ||
       (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_450._M_node[1]._M_prev,ExpectedLiteral), !bVar5)) {
      FormatString<char[10],char_const*,char[9],char_const*,char[11]>
                (&err_4,(Diligent *)"Missing \'",(char (*) [10])&ExpectedLiteral,
                 (char **)"\' after ",(char (*) [9])Args_00,(char **)" direction",
                 (char (*) [11])in_stack_fffffffffffffba8);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&GLSLVariable,local_400,&local_450,4);
      Args = &err_4;
      in_stack_fffffffffffffba8 = &GLSLVariable;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcd0,&err_4,(char (*) [2])0x5ddb85,&GLSLVariable);
      std::__cxx11::string::~string((string *)&GLSLVariable);
      std::__cxx11::string::~string((string *)&err_4);
    }
    Args_00 = (Char **)((long)Args_00 + 8);
  }
  std::__cxx11::string::_M_assign((string *)(*(long *)local_408 + 0x38));
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::erase
            (this_00,(const_iterator)__first._M_node,*(_List_node_base **)pSVar12);
  poVar8 = std::operator<<(local_1a8,"layout ( local_size_x = ");
  poVar8 = std::operator<<(poVar8,(string *)CSGroupSize);
  poVar8 = std::operator<<(poVar8,", local_size_y = ");
  poVar8 = std::operator<<(poVar8,(string *)(CSGroupSize + 1));
  poVar8 = std::operator<<(poVar8,", local_size_z = ");
  poVar8 = std::operator<<(poVar8,(string *)(CSGroupSize + 2));
  std::operator<<(poVar8," ) in;\n");
  p_Var3 = (_Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            *)&(local_410._M_nxt)->_M_nxt;
  local_410._M_nxt = local_410._M_nxt[1]._M_nxt;
  for (pSVar12 = (p_Var3->_M_impl).super__Vector_impl_data._M_start;
      pSVar12 != (pointer)local_410._M_nxt; pSVar12 = pSVar12 + 1) {
    if (pSVar12->storageQualifier == Out) {
      LogError<true,char[52]>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcf6,(char (*) [52])"Output variables are not allowed in compute shaders");
    }
    else if (pSVar12->storageQualifier == In) {
      ExpectedLiteral = (Char *)0x0;
      ppSStack_420 = (pointer)0x0;
      local_418 = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      err_4._M_dataplus._M_p = (pointer)pSVar12;
      std::
      vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
      ::emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  *)&ExpectedLiteral,(ShaderParameterInfo **)&err_4);
      err_4._M_dataplus._M_p =
           (pointer)(pSVar12->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
      ::
      emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  *)&MemberItStack,
                 (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)&err_4);
      pSVar4 = pSVar12;
      if (((pSVar12->storageQualifier != Ret) && ((pSVar12->GSAttribs).PrimType == Undefined)) &&
         ((pSVar12->HSAttribs).PatchType == Undefined)) {
        poVar8 = std::operator<<(local_330,"    ");
        poVar8 = std::operator<<(poVar8,(pSVar12->Type)._M_dataplus._M_p);
        poVar8 = std::operator<<(poVar8,' ');
        std::operator<<(poVar8,(pSVar12->Name)._M_dataplus._M_p);
        if ((pSVar12->ArraySize)._M_string_length != 0) {
          poVar8 = std::operator<<(local_330,'[');
          poVar8 = std::operator<<(poVar8,(string *)&pSVar12->ArraySize);
          std::operator<<(poVar8,']');
        }
        std::operator<<(local_330,";\n");
      }
      while (local_408 = pSVar4, (pointer)ExpectedLiteral != ppSStack_420) {
        pSVar1 = ppSStack_420[-1];
        Args_1 = (pSVar1->members).
                 super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar9 = (pSVar1->members).
                 super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (Args_1 == pSVar9) {
          if (MemberItStack.
              super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current != Args_1) {
            FormatString<char[26],char[49]>
                      (&err_4,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                       (char (*) [49])Args_1);
            DebugAssertionFailed
                      (err_4._M_dataplus._M_p,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb19);
            std::__cxx11::string::~string((string *)&err_4);
          }
          if ((pSVar1->Semantic)._M_string_length == 0) {
            LogError<true,char[36],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar1->Name,
                       (char (*) [2])0x5ff13f);
          }
          GLSLVariable._M_dataplus._M_p = (pointer)&GLSLVariable.field_2;
          GLSLVariable._M_string_length = 0;
          GLSLVariable.field_2._M_local_buf[0] = '\0';
          pHVar2 = local_400->m_Converter;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&err_4,(pSVar1->Semantic)._M_dataplus._M_p,false);
          this_01 = (ConversionStream *)&err_4;
          cVar10 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)((pHVar2->m_HLSLSemanticToGLSLVar)._M_elems + 5),(key_type *)&err_4);
          HashMapStringKey::Clear((HashMapStringKey *)&err_4);
          if (cVar10.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            this_01 = (ConversionStream *)
                      ((long)cVar10.
                             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 0x18);
            std::__cxx11::string::_M_assign((string *)&GLSLVariable);
          }
          BuildParameterName_abi_cxx11_
                    ((String *)&err_4,this_01,
                     (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                      *)&ExpectedLiteral,'.',"","","");
          if (GLSLVariable._M_string_length == 0) {
            LogError<true,char[28],std::__cxx11::string,char[142]>
                      (false,"operator()",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xcee,(char (*) [28])"Unexpected input semantic \"",&pSVar1->Semantic,
                       (char (*) [142])
                       "\". The only allowed semantics for the compute shader inputs are \"SV_DispatchThreadID\", \"SV_GroupID\", \"SV_GroupThreadID\", and \"SV_GroupIndex\"."
                      );
          }
          poVar8 = std::operator<<(local_330,"    ");
          poVar8 = std::operator<<(poVar8,(string *)&GLSLVariable);
          poVar8 = std::operator<<(poVar8,'(');
          poVar8 = std::operator<<(poVar8,(string *)&pSVar1->Type);
          poVar8 = std::operator<<(poVar8,",");
          poVar8 = std::operator<<(poVar8,(string *)&err_4);
          std::operator<<(poVar8,");\n");
          std::__cxx11::string::~string((string *)&err_4);
          ppSStack_420 = ppSStack_420 + -1;
          MemberItStack.
          super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberItStack.
               super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          std::__cxx11::string::~string((string *)&GLSLVariable);
          pSVar12 = local_408;
          pSVar4 = local_408;
        }
        else {
          if ((pSVar1->Semantic)._M_string_length != 0) {
            LogError<true,char[35],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar1->Name,
                       (char (*) [2])0x5ff13f);
            pSVar9 = (pSVar1->members).
                     super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          pSVar1 = MemberItStack.
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current;
          if (pSVar1 == pSVar9) {
            ppSStack_420 = ppSStack_420 + -1;
            pSVar4 = local_408;
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberItStack.
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          else {
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current = pSVar1 + 1;
            err_4._M_dataplus._M_p = (pointer)pSVar1;
            std::
            vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
            ::
            emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                      ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                        *)&ExpectedLiteral,(ShaderParameterInfo **)&err_4);
            err_4._M_dataplus._M_p =
                 (pointer)(pSVar1->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
            ::
            emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                      ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                        *)&MemberItStack,
                       (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)&err_4);
            pSVar4 = local_408;
          }
        }
      }
      std::
      _Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ::~_Vector_base(&MemberItStack.
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                     );
      std::
      _Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ::~_Vector_base((_Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                       *)&ExpectedLiteral);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_3b8[0],(string *)&err_4);
  std::__cxx11::string::~string((string *)&err_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_3b8[1],(string *)&err_4);
  std::__cxx11::string::~string((string *)&err_4);
  lVar7 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&CSGroupSize[0]._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  std::__cxx11::stringstream::~stringstream((stringstream *)&PrologueSS);
  std::__cxx11::stringstream::~stringstream((stringstream *)&GlobalVarsSS);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessComputeShaderArguments(TokenListType::iterator&          TypeToken,
                                                                             std::vector<ShaderParameterInfo>& Params,
                                                                             String&                           GlobalVariables,
                                                                             String&                           Prologue)
{
    stringstream GlobalVarsSS, PrologueSS;

    auto Token = TypeToken;
    //[numthreads(16,16,1)]
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    //^
    --Token;
    //[numthreads(16,16,1)]
    //                    ^
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.begin() && Token->Type == TokenType::ClosingSquareBracket, "Missing numthreads declaration");

    while (Token != m_Tokens.begin() && Token->Type != TokenType::OpenSquareBracket)
        --Token;
    //[numthreads(16,16,1)]
    //^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.begin(), "Missing numthreads() declaration");
    auto OpenStapleToken = Token;

    ++Token;
    //[numthreads(16,16,1)]
    // ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::Identifier && Token->Literal == "numthreads",
                        "Missing numthreads() declaration");

    ++Token;
    //[numthreads(16,16,1)]
    //           ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::OpenParen,
                        "Missing \'(\' after numthreads");

    String             CSGroupSize[3] = {};
    static const Char* DirNames[]     = {"X", "Y", "Z"};
    for (int i = 0; i < 3; ++i)
    {
        ++Token;
        //[numthreads(16,16,1)]
        //            ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && (Token->Type == TokenType::NumericConstant || Token->Type == TokenType::Identifier),
                            "Missing group size for ", DirNames[i], " direction");
        CSGroupSize[i] = Token->Literal.c_str();
        ++Token;
        //[numthreads(16,16,1)]
        //              ^    ^
        const Char* ExpectedLiteral = (i < 2) ? "," : ")";
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Literal == ExpectedLiteral,
                            "Missing \'", ExpectedLiteral, "\' after ", DirNames[i], " direction");
    }

    //OpenStapleToken
    //V
    //[numthreads(16,16,1)]
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    //^
    //TypeToken
    TypeToken->Delimiter = OpenStapleToken->Delimiter;
    m_Tokens.erase(OpenStapleToken, TypeToken);
    //
    // void TestCS(uint3 DTid : SV_DispatchThreadID)

    GlobalVarsSS << "layout ( local_size_x = " << CSGroupSize[0]
                 << ", local_size_y = " << CSGroupSize[1] << ", local_size_z = " << CSGroupSize[2] << " ) in;\n";

    for (const auto& Param : Params)
    {
        if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            ProcessShaderArgument(
                Param, CSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.');
                    if (Getter.empty())
                    {
                        LOG_ERROR_AND_THROW("Unexpected input semantic \"", Param.Semantic,
                                            "\". The only allowed semantics for the compute shader inputs are \"SV_DispatchThreadID\", "
                                            "\"SV_GroupID\", \"SV_GroupThreadID\", and \"SV_GroupIndex\".");
                    }
                    PrologueSS << "    " << Getter << '(' << Param.Type << "," << FullParamName << ");\n";
                } //
            );
        }
        else if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Out)
        {
            LOG_ERROR_AND_THROW("Output variables are not allowed in compute shaders");
        }
    }

    GlobalVariables = GlobalVarsSS.str();
    Prologue        = PrologueSS.str();
}